

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O2

void xmrig::cryptonight_double_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  ulong *puVar1;
  long *plVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  cryptonight_ctx *input_00;
  cryptonight_ctx *input_01;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  __m128i bx0;
  __m128i bx0_00;
  __m128i bx1;
  __m128i bx1_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint8_t *hashval;
  ulong uVar21;
  __m128i *cx;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong uVar26;
  long extraout_XMM0_Qa;
  long extraout_XMM0_Qa_00;
  ulong uVar27;
  uint uVar28;
  uint uVar30;
  ulong uVar29;
  uint uVar31;
  uint uVar33;
  ulong uVar32;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  __m128i ax0;
  __m128i ax0_00;
  __m128i *output_00;
  __m128i *input_02;
  __m128i *output_01;
  __m128i *palVar45;
  undefined8 local_128;
  undefined8 uStack_120;
  __m128i cx0;
  long local_d8;
  long local_c8;
  ulong local_b8;
  ulong local_a8;
  __m128i cx1;
  
  input_00 = *ctx;
  keccak(input,size,input_00->state);
  input_01 = ctx[1];
  keccak(input + size,size,input_01->state);
  output_00 = (__m128i *)input_00->memory;
  output_01 = (__m128i *)input_01->memory;
  local_a8 = *(ulong *)((long)input_00->state + 0x60);
  local_d8 = *(long *)((long)input_00->state + 0x68);
  local_b8 = *(ulong *)((long)input_01->state + 0x60);
  local_c8 = *(long *)((long)input_01->state + 0x68);
  fesetround(0x400);
  cn_explode_scratchpad<true>((__m128i *)input_00,output_00);
  cn_explode_scratchpad<true>((__m128i *)input_01,output_01);
  local_128 = CONCAT44(*(uint *)((long)input_00->state + 0x24) ^
                       *(uint *)((long)input_00->state + 4),
                       *(uint *)((long)input_00->state + 0x20) ^ (uint)*(longlong *)input_00->state)
  ;
  uStack_120 = CONCAT44(*(uint *)((long)input_00->state + 0x2c) ^
                        *(uint *)((long)input_00->state + 0xc),
                        *(uint *)((long)input_00->state + 0x28) ^
                        (uint)*(longlong *)((long)input_00->state + 8));
  uVar29 = *(ulong *)((long)input_01->state + 0x20) ^ *(ulong *)input_01->state;
  uVar32 = *(ulong *)((long)input_01->state + 0x28) ^ *(longlong *)((long)input_01->state + 8);
  uVar42 = *(ulong *)((long)input_01->state + 0x50) ^ *(ulong *)((long)input_01->state + 0x40);
  uVar43 = *(ulong *)((long)input_01->state + 0x58) ^ *(ulong *)((long)input_01->state + 0x48);
  uVar16 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  uVar38 = *(uint *)((long)input_01->state + 0x30) ^ *(uint *)((long)input_01->state + 0x10);
  uVar39 = *(uint *)((long)input_01->state + 0x34) ^ *(uint *)((long)input_01->state + 0x14);
  uVar40 = *(uint *)((long)input_01->state + 0x38) ^ *(uint *)((long)input_01->state + 0x18);
  uVar41 = *(uint *)((long)input_01->state + 0x3c) ^ *(uint *)((long)input_01->state + 0x1c);
  uVar4 = *(uint *)((long)input_00->state + 0x30) ^ *(uint *)((long)input_00->state + 0x10);
  uVar5 = *(uint *)((long)input_00->state + 0x34) ^ *(uint *)((long)input_00->state + 0x14);
  uVar6 = *(uint *)((long)input_00->state + 0x38) ^ *(uint *)((long)input_00->state + 0x18);
  uVar7 = *(uint *)((long)input_00->state + 0x3c) ^ *(uint *)((long)input_00->state + 0x1c);
  uVar34 = *(uint *)((long)input_00->state + 0x50) ^ *(uint *)((long)input_00->state + 0x40);
  uVar35 = *(uint *)((long)input_00->state + 0x54) ^ *(uint *)((long)input_00->state + 0x44);
  uVar36 = *(uint *)((long)input_00->state + 0x58) ^ *(uint *)((long)input_00->state + 0x48);
  uVar37 = *(uint *)((long)input_00->state + 0x5c) ^ *(uint *)((long)input_00->state + 0x4c);
  input_02 = output_00;
  while (uVar33 = uVar7, uVar31 = uVar6, uVar30 = uVar5, uVar28 = uVar4, bVar25 = uVar16 != 0,
        uVar16 = uVar16 - 1, bVar25) {
    uVar19 = local_128 & 0xffff0;
    uVar4 = *(uint *)((long)*output_00 + uVar19);
    uVar5 = *(uint *)((long)*output_00 + uVar19 + 4);
    uVar6 = *(uint *)((long)*output_00 + uVar19 + 8);
    uVar7 = *(uint *)((long)*output_00 + uVar19 + 0xc);
    uVar44 = CONCAT44(saes_table[1][uVar6 >> 8 & 0xff] ^ saes_table[0][uVar5 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc)),
                      saes_table[1][uVar5 >> 8 & 0xff] ^ saes_table[0][uVar4 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar7 >> 0x16 & 0xfffffffc))) ^
             local_128;
    cx0[1] = CONCAT44(saes_table[1][uVar4 >> 8 & 0xff] ^ saes_table[0][uVar7 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar6 >> 0x16 & 0xfffffffc)),
                      saes_table[1][uVar7 >> 8 & 0xff] ^ saes_table[0][uVar6 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar5 >> 0x16 & 0xfffffffc))) ^
             uStack_120;
    uVar22 = uVar29 & 0xffff0;
    uVar4 = *(uint *)((long)*output_01 + uVar22);
    uVar5 = *(uint *)((long)*output_01 + uVar22 + 4);
    uVar6 = *(uint *)((long)*output_01 + uVar22 + 8);
    uVar7 = *(uint *)((long)*output_01 + uVar22 + 0xc);
    cx = (__m128i *)(ulong)(uVar7 >> 0x16 & 0xfffffffc);
    ax0[1]._0_4_ = saes_table[1][uVar6 >> 8 & 0xff] ^ saes_table[0][uVar5 & 0xff] ^
                   *(uint *)((long)saes_table[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
                   *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc));
    uVar26 = CONCAT44((uint)ax0[1],
                      saes_table[1][uVar5 >> 8 & 0xff] ^ saes_table[0][uVar4 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
                      (uint)cx[0x198e3][0]);
    uVar26 = uVar26 ^ uVar29;
    uVar27 = CONCAT44(saes_table[1][uVar4 >> 8 & 0xff] ^ saes_table[0][uVar7 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar6 >> 0x16 & 0xfffffffc)),
                      saes_table[1][uVar7 >> 8 & 0xff] ^ saes_table[0][uVar6 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar5 >> 0x16 & 0xfffffffc))) ^ uVar32
    ;
    bx0[1] = (longlong)output_01;
    bx0[0] = (longlong)input_02;
    bx1[1] = uVar27;
    bx1[0] = uVar26;
    ax0[0] = (longlong)cx0;
    ax0[1]._4_4_ = 0;
    uVar18 = (ulong)(uint)ax0[1];
    palVar45 = output_01;
    cx0[0] = uVar44;
    cx1[0] = uVar26;
    cx1[1] = uVar27;
    cryptonight_monero_tweak
              ((uint64_t *)((long)*output_00 + uVar19),(uint8_t *)output_00,uVar19,ax0,bx0,bx1,cx);
    bx0_00[1] = (longlong)palVar45;
    bx0_00[0] = (longlong)input_02;
    bx1_00[1] = uVar27;
    bx1_00[0] = uVar26;
    ax0_00[1] = uVar18;
    ax0_00[0] = (longlong)cx1;
    cryptonight_monero_tweak
              ((uint64_t *)((long)*output_01 + uVar22),(uint8_t *)output_01,uVar22,ax0_00,bx0_00,
               bx1_00,cx);
    uVar24 = uVar44 & 0xffff0;
    uVar23 = local_d8 << 0x20 ^ local_a8 ^ *(ulong *)((long)*output_00 + uVar24);
    uVar19 = (ulong)((int)uVar44 + (int)local_d8 * 2 & 0x7ffffffe) | 0x80000001;
    local_a8 = (ulong)cx0[1] / uVar19 & 0xffffffff | (ulong)cx0[1] % uVar19 << 0x20;
    uVar19 = *(ulong *)((long)*output_00 + uVar24 + 8);
    int_sqrt_v2(local_a8 + uVar44);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar23;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar44;
    uVar20 = SUB168(auVar8 * auVar10,8);
    uVar17 = SUB168(auVar8 * auVar10,0);
    puVar1 = (ulong *)((long)*output_00 + (uVar24 ^ 0x10));
    uVar44 = *puVar1;
    uVar15 = puVar1[1];
    uVar21 = uVar24 ^ 0x20;
    uVar18 = *(ulong *)((long)*output_00 + uVar21);
    uVar22 = *(ulong *)((long)*output_00 + uVar21 + 8);
    plVar2 = (long *)((long)*output_00 + (uVar24 ^ 0x30));
    lVar12 = plVar2[1];
    plVar3 = (long *)((long)*output_00 + uVar21);
    lVar13 = *plVar3;
    lVar14 = plVar3[1];
    plVar3 = (long *)((long)*output_00 + (uVar24 ^ 0x10));
    *plVar3 = CONCAT44(uVar35,uVar34) + *plVar2;
    plVar3[1] = CONCAT44(uVar37,uVar36) + lVar12;
    plVar2 = (long *)((long)*output_00 + uVar21);
    *plVar2 = (uVar20 ^ uVar44) + CONCAT44(uVar30,uVar28);
    plVar2[1] = (uVar17 ^ uVar15) + CONCAT44(uVar33,uVar31);
    plVar2 = (long *)((long)*output_00 + (uVar24 ^ 0x30));
    *plVar2 = lVar13 + local_128;
    plVar2[1] = lVar14 + uStack_120;
    local_128 = (uVar20 ^ uVar18) + local_128;
    uStack_120 = (uVar17 ^ uVar22) + uStack_120;
    puVar1 = (ulong *)((long)*output_00 + uVar24);
    *puVar1 = local_128;
    puVar1[1] = uStack_120;
    uVar21 = uVar26 & 0xffff0;
    uVar24 = local_c8 << 0x20 ^ local_b8 ^ *(ulong *)((long)*output_01 + uVar21);
    uVar18 = (ulong)((int)uVar26 + (int)local_c8 * 2 & 0x7ffffffe) | 0x80000001;
    local_128 = uVar23 ^ local_128;
    uStack_120 = uVar19 ^ uStack_120;
    local_b8 = uVar27 / uVar18 & 0xffffffff | uVar27 % uVar18 << 0x20;
    uVar19 = *(ulong *)((long)*output_01 + uVar21 + 8);
    int_sqrt_v2(local_b8 + uVar26);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar24;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar26;
    uVar20 = SUB168(auVar9 * auVar11,8);
    uVar17 = SUB168(auVar9 * auVar11,0);
    puVar1 = (ulong *)((long)*output_01 + (uVar21 ^ 0x10));
    uVar44 = *puVar1;
    uVar15 = puVar1[1];
    uVar23 = uVar21 ^ 0x20;
    uVar18 = *(ulong *)((long)*output_01 + uVar23);
    uVar22 = *(ulong *)((long)*output_01 + uVar23 + 8);
    plVar2 = (long *)((long)*output_01 + (uVar21 ^ 0x30));
    lVar12 = plVar2[1];
    plVar3 = (long *)((long)*output_01 + uVar23);
    lVar13 = *plVar3;
    lVar14 = plVar3[1];
    plVar3 = (long *)((long)*output_01 + (uVar21 ^ 0x10));
    *plVar3 = uVar42 + *plVar2;
    plVar3[1] = uVar43 + lVar12;
    uVar42 = CONCAT44(uVar39,uVar38);
    uVar43 = CONCAT44(uVar41,uVar40);
    plVar2 = (long *)((long)*output_01 + uVar23);
    *plVar2 = (uVar20 ^ uVar44) + uVar42;
    plVar2[1] = (uVar17 ^ uVar15) + uVar43;
    plVar2 = (long *)((long)*output_01 + (uVar21 ^ 0x30));
    *plVar2 = lVar13 + uVar29;
    plVar2[1] = lVar14 + uVar32;
    uVar29 = (uVar20 ^ uVar18) + uVar29;
    uVar32 = (uVar17 ^ uVar22) + uVar32;
    puVar1 = (ulong *)((long)*output_01 + uVar21);
    *puVar1 = uVar29;
    puVar1[1] = uVar32;
    uVar29 = uVar24 ^ uVar29;
    uVar32 = uVar19 ^ uVar32;
    uVar38 = (uint)cx1[0];
    uVar39 = cx1[0]._4_4_;
    uVar40 = (uint)cx1[1];
    uVar41 = cx1[1]._4_4_;
    uVar4 = (uint)cx0[0];
    uVar5 = cx0[0]._4_4_;
    uVar6 = (uint)cx0[1];
    uVar7 = cx0[1]._4_4_;
    uVar34 = uVar28;
    uVar35 = uVar30;
    uVar36 = uVar31;
    uVar37 = uVar33;
    output_01 = palVar45;
    local_d8 = extraout_XMM0_Qa;
    local_c8 = extraout_XMM0_Qa_00;
  }
  cn_implode_scratchpad<true>(input_02,(__m128i *)input_00);
  cn_implode_scratchpad<true>(output_01,(__m128i *)input_01);
  keccakf((uint64_t *)input_00,0x18);
  keccakf((uint64_t *)input_01,0x18);
  (*(code *)(&extra_hashes)[(byte)*(longlong *)input_00->state & 3])(input_00,200,output);
  hashval = output + 0x20;
  switch((byte)*(longlong *)input_01->state & 3) {
  case 0:
    blake256_hash(hashval,input_01->state,200);
    return;
  case 1:
    groestl(input_01->state,0x640,hashval);
    return;
  case 2:
    jh_hash(0x100,input_01->state,0x640,hashval);
    return;
  case 3:
    xmr_skein(input_01->state,hashval);
    return;
  }
}

Assistant:

inline void cryptonight_double_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input,        size, ctx[0]->state);
    keccak(input + size, size, ctx[1]->state);

    uint8_t *l0  = ctx[0]->memory;
    uint8_t *l1  = ctx[1]->memory;
    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t *h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);

    VARIANT2_INIT(0);
    VARIANT2_INIT(1);
    VARIANT2_SET_ROUNDING_MODE();

    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h0), reinterpret_cast<__m128i *>(l0));
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h1), reinterpret_cast<__m128i *>(l1));

    uint64_t al0 = h0[0] ^ h0[4];
    uint64_t al1 = h1[0] ^ h1[4];
    uint64_t ah0 = h0[1] ^ h0[5];
    uint64_t ah1 = h1[1] ^ h1[5];

    __m128i bx00 = _mm_set_epi64x(h0[3] ^ h0[7], h0[2] ^ h0[6]);
    __m128i bx01 = _mm_set_epi64x(h0[9] ^ h0[11], h0[8] ^ h0[10]);
    __m128i bx10 = _mm_set_epi64x(h1[3] ^ h1[7], h1[2] ^ h1[6]);
    __m128i bx11 = _mm_set_epi64x(h1[9] ^ h1[11], h1[8] ^ h1[10]);

    uint64_t idx0 = al0;
    uint64_t idx1 = al1;

    for (size_t i = 0; i < iters; i++) {
        __m128i cx0, cx1;
        if (!SOFT_AES) {
            cx0 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
            cx1 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l1[idx1 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(ah0, al0);
        const __m128i ax1 = _mm_set_epi64x(ah1, al1);
        if (SOFT_AES) {
            cx0 = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
            cx1 = soft_aesenc(&l1[idx1 & MASK], ax1, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx0 = _mm_aesenc_si128(cx0, ax0);
            cx1 = _mm_aesenc_si128(cx1, ax1);
        }

        cryptonight_monero_tweak((uint64_t*)&l0[idx0 & MASK], l0, idx0 & MASK, ax0, bx00, bx01, cx0);
        cryptonight_monero_tweak((uint64_t*)&l1[idx1 & MASK], l1, idx1 & MASK, ax1, bx10, bx11, cx1);

        idx0 = _mm_cvtsi128_si64(cx0);
        idx1 = _mm_cvtsi128_si64(cx1);

        uint64_t hi, lo, cl, ch;
        cl = ((uint64_t*) &l0[idx0 & MASK])[0];
        ch = ((uint64_t*) &l0[idx0 & MASK])[1];

        VARIANT2_INTEGER_MATH(0, cl, cx0);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx00, bx01, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        ((uint64_t*)&l0[idx0 & MASK])[0] = al0;
        ((uint64_t*) &l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;

        cl = ((uint64_t*) &l1[idx1 & MASK])[0];
        ch = ((uint64_t*) &l1[idx1 & MASK])[1];

        VARIANT2_INTEGER_MATH(1, cl, cx1);

        lo = __umul128(idx1, cl, &hi);

        VARIANT2_SHUFFLE2(l1, idx1 & MASK, ax1, bx10, bx11, hi, lo, 0);

        al1 += hi;
        ah1 += lo;

        ((uint64_t*)&l1[idx1 & MASK])[0] = al1;
        ((uint64_t*)&l1[idx1 & MASK])[1] = ah1;

        al1 ^= cl;
        ah1 ^= ch;
        idx1 = al1;

        bx01 = bx00;
        bx11 = bx10;

        bx00 = cx0;
        bx10 = cx1;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l0), reinterpret_cast<__m128i *>(h0));
    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l1), reinterpret_cast<__m128i *>(h1));

    keccakf(h0, 24);
    keccakf(h1, 24);

    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
    extra_hashes[ctx[1]->state[0] & 3](ctx[1]->state, 200, output + 32);
}